

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

char * __thiscall bsplib::exception::what(exception *this)

{
  char *pcVar1;
  string local_30 [32];
  exception *local_10;
  exception *this_local;
  
  local_10 = this;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_buf,local_30);
  std::__cxx11::string::~string(local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

virtual const char * what() const throw()
    { m_buf = m_stream.str();
      return m_buf.c_str(); 
    }